

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Parameters PVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Incppect<false> *pIVar2;
  undefined8 *in_RSI;
  int in_EDI;
  char *var_str;
  double var_double;
  float var_float;
  int32_t var_arr32 [4];
  int32_t var_int32;
  int16_t var_int16;
  int8_t var_int8;
  Parameters parameters;
  string httpRoot;
  int port;
  undefined8 in_stack_fffffffffffff9f8;
  Parameters *in_stack_fffffffffffffa00;
  anon_class_8_1_ffa4e408 *in_stack_fffffffffffffa08;
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  *in_stack_fffffffffffffa10;
  iterator in_stack_fffffffffffffa18;
  char *in_stack_fffffffffffffa20;
  Parameters *in_stack_fffffffffffffa28;
  Parameters *in_stack_fffffffffffffa30;
  char *in_stack_fffffffffffffa38;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined8 in_stack_fffffffffffffa48;
  Parameters *in_stack_fffffffffffffa50;
  undefined8 in_stack_fffffffffffffa58;
  undefined8 in_stack_fffffffffffffa60;
  undefined8 in_stack_fffffffffffffa68;
  undefined8 in_stack_fffffffffffffa70;
  undefined8 in_stack_fffffffffffffa78;
  undefined8 in_stack_fffffffffffffa80;
  string *local_508;
  int local_4c0;
  int local_4bc;
  duration<long,std::ratio<1l,1000l>> local_4b8 [8];
  char **local_4b0;
  allocator<char> local_481;
  function local_480 [32];
  undefined8 *local_460;
  char local_458 [39];
  undefined1 local_431 [33];
  undefined4 *local_410;
  allocator<char> local_3e1;
  function local_3e0 [32];
  undefined8 *local_3c0;
  allocator<char> local_391;
  function local_390 [32];
  undefined8 *local_370;
  allocator<char> local_341;
  function local_340 [32];
  undefined4 *local_320;
  allocator<char> local_2f1;
  function local_2f0 [32];
  undefined2 *local_2d0;
  allocator<char> local_2a1;
  function local_2a0 [32];
  undefined1 *local_280;
  allocator<char> local_251;
  function local_250 [32];
  char *local_230;
  undefined8 local_228;
  undefined4 local_21c;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined4 local_200;
  undefined2 local_1fc;
  undefined1 local_1f9 [158];
  undefined1 local_15b;
  allocator<char> local_15a;
  allocator<char> local_159;
  string *local_158;
  string local_150 [32];
  undefined1 local_130 [32];
  string *local_110;
  undefined8 local_108;
  string local_100 [32];
  int local_e0;
  undefined4 local_dc;
  string local_c8 [143];
  allocator<char> local_39 [37];
  int local_14;
  undefined8 *local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  printf("Usage: %s [port] [httpRoot]\n",*in_RSI);
  if (local_8 < 2) {
    local_4c0 = 3000;
  }
  else {
    local_4c0 = atoi((char *)local_10[1]);
  }
  local_14 = local_4c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
             (allocator<char> *)in_stack_fffffffffffffa30);
  std::allocator<char>::~allocator(local_39);
  Incppect<false>::Parameters::Parameters(in_stack_fffffffffffffa50);
  local_e0 = local_14;
  local_dc = 0x40000;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
  std::__cxx11::string::operator=(local_c8,local_100);
  std::__cxx11::string::~string(local_100);
  local_15b = 1;
  local_158 = local_150;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
             (allocator<char> *)in_stack_fffffffffffffa30);
  local_158 = (string *)local_130;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
             (allocator<char> *)in_stack_fffffffffffffa30);
  local_15b = 0;
  local_110 = local_150;
  local_108 = 2;
  __l._M_len = (size_type)in_stack_fffffffffffffa20;
  __l._M_array = in_stack_fffffffffffffa18;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffa10,__l);
  local_508 = (string *)&local_110;
  do {
    local_508 = local_508 + -0x20;
    std::__cxx11::string::~string(local_508);
  } while (local_508 != local_150);
  std::allocator<char>::~allocator(&local_15a);
  std::allocator<char>::~allocator(&local_159);
  Incppect<false>::getInstance();
  Incppect<false>::Parameters::Parameters(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
  PVar1.tLastRequestTimeout_ms = (int64_t)in_stack_fffffffffffffa00;
  PVar1.portListen = (int)in_stack_fffffffffffff9f8;
  PVar1.maxPayloadLength_bytes = (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20);
  PVar1._16_8_ = in_stack_fffffffffffffa08;
  PVar1.httpRoot._0_8_ = in_stack_fffffffffffffa10;
  PVar1.httpRoot._M_string_length = (size_type)in_stack_fffffffffffffa18;
  PVar1.httpRoot.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffa20;
  PVar1.httpRoot.field_2._8_8_ = in_stack_fffffffffffffa28;
  PVar1.resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffa30;
  PVar1.resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffa38;
  PVar1.resources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffa40;
  PVar1.sslKey._0_8_ = in_stack_fffffffffffffa48;
  PVar1.sslKey._M_string_length = (size_type)in_stack_fffffffffffffa50;
  PVar1.sslKey.field_2._M_allocated_capacity = in_stack_fffffffffffffa58;
  PVar1.sslKey.field_2._8_8_ = in_stack_fffffffffffffa60;
  PVar1.sslCert._0_8_ = in_stack_fffffffffffffa68;
  PVar1.sslCert._M_string_length = in_stack_fffffffffffffa70;
  PVar1.sslCert.field_2._M_allocated_capacity = in_stack_fffffffffffffa78;
  PVar1.sslCert.field_2._8_8_ = in_stack_fffffffffffffa80;
  Incppect<false>::runAsync(PVar1);
  std::thread::detach();
  std::thread::~thread((thread *)0x1056ea);
  Incppect<false>::Parameters::~Parameters(in_stack_fffffffffffffa00);
  local_1f9[0] = 1;
  local_1fc = 2;
  local_200 = 3;
  local_218 = 0x500000004;
  uStack_210 = 0x700000006;
  local_21c = 0x41000000;
  local_228 = 0x4030000000000000;
  local_230 = "hello browser";
  pIVar2 = Incppect<false>::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
             (allocator<char> *)in_stack_fffffffffffffa30);
  local_280 = local_1f9;
  std::
  function<std::basic_string_view<char,std::char_traits<char>>(std::vector<int,std::allocator<int>>const&)>
  ::function<main::__0,void>
            (in_stack_fffffffffffffa10,(anon_class_8_1_9ce7ddbf *)in_stack_fffffffffffffa08);
  Incppect<false>::var((string *)pIVar2,local_250);
  std::
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  ::~function((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
               *)0x1057ea);
  std::__cxx11::string::~string((string *)local_250);
  std::allocator<char>::~allocator(&local_251);
  pIVar2 = Incppect<false>::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
             (allocator<char> *)in_stack_fffffffffffffa30);
  local_2d0 = &local_1fc;
  std::
  function<std::basic_string_view<char,std::char_traits<char>>(std::vector<int,std::allocator<int>>const&)>
  ::function<main::__1,void>
            (in_stack_fffffffffffffa10,(anon_class_8_1_0013d5dc *)in_stack_fffffffffffffa08);
  Incppect<false>::var((string *)pIVar2,local_2a0);
  std::
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  ::~function((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
               *)0x10589f);
  std::__cxx11::string::~string((string *)local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  pIVar2 = Incppect<false>::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
             (allocator<char> *)in_stack_fffffffffffffa30);
  local_320 = &local_200;
  std::
  function<std::basic_string_view<char,std::char_traits<char>>(std::vector<int,std::allocator<int>>const&)>
  ::function<main::__2,void>
            (in_stack_fffffffffffffa10,(anon_class_8_1_0013d616 *)in_stack_fffffffffffffa08);
  Incppect<false>::var((string *)pIVar2,local_2f0);
  std::
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  ::~function((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
               *)0x105954);
  std::__cxx11::string::~string((string *)local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  pIVar2 = Incppect<false>::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
             (allocator<char> *)in_stack_fffffffffffffa30);
  local_370 = &local_218;
  std::
  function<std::basic_string_view<char,std::char_traits<char>>(std::vector<int,std::allocator<int>>const&)>
  ::function<main::__3,void>(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
  Incppect<false>::var((string *)pIVar2,local_340);
  std::
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  ::~function((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
               *)0x105a09);
  std::__cxx11::string::~string((string *)local_340);
  std::allocator<char>::~allocator(&local_341);
  pIVar2 = Incppect<false>::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
             (allocator<char> *)in_stack_fffffffffffffa30);
  local_3c0 = &local_218;
  std::
  function<std::basic_string_view<char,std::char_traits<char>>(std::vector<int,std::allocator<int>>const&)>
  ::function<main::__4,void>(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
  Incppect<false>::var((string *)pIVar2,local_390);
  std::
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  ::~function((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
               *)0x105ab2);
  std::__cxx11::string::~string((string *)local_390);
  std::allocator<char>::~allocator(&local_391);
  pIVar2 = Incppect<false>::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
             (allocator<char> *)in_stack_fffffffffffffa30);
  local_410 = &local_21c;
  std::
  function<std::basic_string_view<char,std::char_traits<char>>(std::vector<int,std::allocator<int>>const&)>
  ::function<main::__5,void>
            (in_stack_fffffffffffffa10,(anon_class_8_1_ffe899e4 *)in_stack_fffffffffffffa08);
  Incppect<false>::var((string *)pIVar2,local_3e0);
  std::
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  ::~function((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
               *)0x105b55);
  std::__cxx11::string::~string((string *)local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  pIVar2 = Incppect<false>::getInstance();
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_431;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,in_stack_fffffffffffffa38,(allocator<char> *)in_stack_fffffffffffffa30);
  local_460 = &local_228;
  __s = local_458;
  std::
  function<std::basic_string_view<char,std::char_traits<char>>(std::vector<int,std::allocator<int>>const&)>
  ::function<main::__6,void>
            (in_stack_fffffffffffffa10,(anon_class_8_1_f9edf1a7 *)in_stack_fffffffffffffa08);
  Incppect<false>::var((string *)pIVar2,(function *)(local_431 + 1));
  std::
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  ::~function((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
               *)0x105bf8);
  std::__cxx11::string::~string((string *)(local_431 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_431);
  pIVar2 = Incppect<false>::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,__s,(allocator<char> *)pIVar2);
  local_4b0 = &local_230;
  std::
  function<std::basic_string_view<char,std::char_traits<char>>(std::vector<int,std::allocator<int>>const&)>
  ::function<main::__7,void>
            (in_stack_fffffffffffffa10,(anon_class_8_1_9172fbf9 *)in_stack_fffffffffffffa08);
  Incppect<false>::var((string *)pIVar2,local_480);
  std::
  function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
  ::~function((function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
               *)0x105c9b);
  std::__cxx11::string::~string((string *)local_480);
  std::allocator<char>::~allocator(&local_481);
  do {
    local_4bc = 1;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_4b8,&local_4bc);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)pIVar2);
  } while( true );
}

Assistant:

int main(int argc, char ** argv) {
	printf("Usage: %s [port] [httpRoot]\n", argv[0]);

    int port = argc > 1 ? atoi(argv[1]) : 3000;
    std::string httpRoot = argc > 2 ? argv[2] : "../examples";

    incppect::Parameters parameters;
    parameters.portListen = port;
    parameters.maxPayloadLength_bytes = 256*1024;
    parameters.httpRoot = httpRoot + "/hello-browser";
    parameters.resources = { "", "index.html", };

    incppect::getInstance().runAsync(parameters).detach();

    int8_t  var_int8  = 1;
    int16_t var_int16 = 2;
    int32_t var_int32 = 3;
    int32_t var_arr32[4] = { 4, 5, 6, 7 };
    float   var_float = 8.0f;
    double  var_double = 16.0f;

    const char * var_str = "hello browser";

    incppect::getInstance().var("var_int8", [&](auto) { return incppect::view(var_int8); });
    incppect::getInstance().var("var_int16", [&](auto) { return incppect::view(var_int16); });
    incppect::getInstance().var("var_int32", [&](auto) { return incppect::view(var_int32); });
    incppect::getInstance().var("var_int32_arr", [&](auto) { return incppect::view(var_arr32); });
    incppect::getInstance().var("var_int32_arr[%d]", [&](auto idxs) { return incppect::view(var_arr32[idxs[0]]); });
    incppect::getInstance().var("var_float", [&](auto idxs) { return incppect::view(var_float); });
    incppect::getInstance().var("var_double", [&](auto idxs) { return incppect::view(var_double); });
    incppect::getInstance().var("var_str", [&](auto idxs) { return var_str; });

    while (true) {
        std::this_thread::sleep_for(std::chrono::milliseconds(1));
    }

    return 0;
}